

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseConfig.cpp
# Opt level: O0

void __thiscall xmrig::BaseConfig::BaseConfig(BaseConfig *this)

{
  IConfig *in_RDI;
  
  IConfig::IConfig(in_RDI);
  in_RDI->_vptr_IConfig = (_func_int **)&PTR__BaseConfig_002b6980;
  *(undefined1 *)&in_RDI[1]._vptr_IConfig = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_IConfig + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_IConfig + 2) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_IConfig + 3) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_IConfig + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_IConfig + 5) = 1;
  Http::Http((Http *)(in_RDI + 2));
  Pools::Pools((Pools *)0x1b57ba);
  String::String((String *)(in_RDI + 0xc));
  String::String((String *)(in_RDI + 0xe));
  String::String((String *)(in_RDI + 0x10));
  String::String((String *)(in_RDI + 0x12));
  String::String((String *)(in_RDI + 0x14));
  *(undefined4 *)&in_RDI[0x16]._vptr_IConfig = 0x3c;
  *(undefined4 *)((long)&in_RDI[0x16]._vptr_IConfig + 4) = 0;
  return;
}

Assistant:

xmrig::BaseConfig::BaseConfig()
{
}